

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O3

void __thiscall asl::HttpMessage::readBody(HttpMessage *this)

{
  HttpSink *pHVar1;
  HttpStatus *pHVar2;
  SmartObject_ *pSVar3;
  _FuncB<void,_const_asl::HttpStatus_&,_asl::NoType> *p_Var4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  undefined8 __s1;
  undefined8 uVar13;
  int iVar14;
  String chunkSize;
  byte buffer [16000];
  String local_3ed8;
  undefined4 local_3ebc;
  String local_3eb8 [667];
  
  String::String(&local_3ed8,"Content-Length");
  header(local_3eb8,this,&local_3ed8);
  uVar13 = local_3eb8[0].field_2._str;
  if (local_3eb8[0]._size == 0) {
    uVar13 = &local_3eb8[0].field_2;
  }
  uVar6 = myatoi((char *)uVar13);
  if (local_3eb8[0]._size != 0) {
    free((void *)local_3eb8[0].field_2._0_8_);
  }
  if (local_3ed8._size != 0) {
    free(local_3ed8.field_2._str);
  }
  String::String(&local_3ed8,"Transfer-Encoding");
  header(local_3eb8,this,&local_3ed8);
  uVar13 = local_3eb8[0].field_2._str;
  iVar14 = local_3eb8[0]._size;
  __s1 = local_3eb8[0].field_2._str;
  if (local_3eb8[0]._size == 0) {
    __s1 = &local_3eb8[0].field_2;
  }
  iVar7 = strcmp((char *)__s1,"chunked");
  if (iVar14 != 0) {
    free((void *)uVar13);
  }
  if (local_3ed8._size != 0) {
    free(local_3ed8.field_2._str);
  }
  pHVar1 = ((this->_sink)._p)->p;
  (*pHVar1->_vptr_HttpSink[4])(pHVar1,(ulong)uVar6);
  (this->_socket->super_SmartObject)._p[3].field_0xc = 1;
  String::String(local_3eb8,"Content-Length");
  bVar5 = hasHeader(this,local_3eb8);
  if (local_3eb8[0]._size != 0) {
    free((void *)local_3eb8[0].field_2._0_8_);
  }
  if (bVar5) {
    String::String(&local_3ed8,"Content-Length");
    header(local_3eb8,this,&local_3ed8);
    uVar13 = &local_3eb8[0].field_2;
    if (local_3eb8[0]._size != 0) {
      uVar13 = local_3eb8[0].field_2._str;
    }
    if (*(char *)uVar13 == '0') {
      uVar13 = &local_3eb8[0].field_2;
      if (local_3eb8[0]._size != 0) {
        uVar13 = local_3eb8[0].field_2._str;
      }
      bVar5 = *(char *)(uVar13 + 1) == '\0';
    }
    else {
      bVar5 = false;
    }
    if (local_3eb8[0]._size != 0) {
      free((void *)local_3eb8[0].field_2._0_8_);
    }
    if (local_3ed8._size != 0) {
      free(local_3ed8.field_2._str);
    }
    if (bVar5) {
      return;
    }
  }
  else if (iVar7 != 0) {
    return;
  }
  pHVar2 = ((this->_status)._p)->p;
  pHVar2->totalReceive = uVar6;
  pHVar2->received = 0;
  iVar14 = 0;
  do {
    iVar8 = (*((this->_socket->super_SmartObject)._p)->_vptr_SmartObject_[0xc])();
    if ((iVar8 < 0) ||
       (iVar8 = (*((this->_socket->super_SmartObject)._p)->_vptr_SmartObject_[0xf])
                          (0x4024000000000000), (char)iVar8 == '\0')) {
      return;
    }
    uVar9 = (*((this->_socket->super_SmartObject)._p)->_vptr_SmartObject_[0xc])();
    if (iVar7 == 0) {
      Socket_::readLine(&local_3ed8,(Socket_ *)(this->_socket->super_SmartObject)._p);
      uVar13 = &local_3ed8.field_2;
      if (local_3ed8._size != 0) {
        uVar13 = local_3ed8.field_2._str;
      }
      uVar11 = strtoul((char *)uVar13,(char **)0x0,0x10);
      local_3ebc = (undefined4)CONCAT71((int7)(uVar11 >> 8),(int)uVar11 == 0);
      if (local_3ed8._size != 0) {
        free(local_3ed8.field_2._str);
      }
    }
    else {
      uVar11 = (ulong)uVar9;
      local_3ebc = 0;
    }
    while (uVar9 = (uint)uVar11, 0 < (int)uVar9) {
      uVar11 = uVar11 & 0xffffffff;
      if (15999 < uVar9) {
        uVar11 = 16000;
      }
      pSVar3 = (this->_socket->super_SmartObject)._p;
      uVar10 = (*pSVar3->_vptr_SmartObject_[0xd])(pSVar3,local_3eb8,uVar11);
      if ((int)uVar10 < 1) {
        return;
      }
      iVar14 = iVar14 + uVar10;
      ((this->_status)._p)->p->received = iVar14;
      pHVar1 = ((this->_sink)._p)->p;
      (*pHVar1->_vptr_HttpSink[2])(pHVar1,local_3eb8,(ulong)uVar10);
      p_Var4 = (this->_progress).f;
      if (p_Var4 != (_FuncB<void,_const_asl::HttpStatus_&,_asl::NoType> *)0x0) {
        (**(code **)(*(long *)p_Var4 + 0x18))(p_Var4,((this->_status)._p)->p);
      }
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar12 = uVar6 - uVar10;
        bVar5 = (int)uVar6 < (int)uVar10;
        uVar6 = uVar12;
        if (uVar12 == 0 || bVar5) {
          return;
        }
      }
      uVar11 = (ulong)(uVar9 - uVar10);
    }
    if ((iVar7 == 0) &&
       (pSVar3 = (this->_socket->super_SmartObject)._p,
       iVar8 = (*pSVar3->_vptr_SmartObject_[0xd])(pSVar3,local_3eb8,2), iVar8 < 2)) {
      return;
    }
    if ((char)local_3ebc != '\0') {
      return;
    }
  } while( true );
}

Assistant:

void HttpMessage::readBody()
{
	int size = header("Content-Length");

	int currentsize = 0;

	bool chunked = header("Transfer-Encoding") == "chunked"; // Handle specially!!

	_sink->init(size);

	_socket->setBlocking(true);

	bool end = false;

	if (hasHeader("Content-Length")) {
		if (header("Content-Length") == "0")
			return;
	}
	else if(!chunked)
		return;

	_status->totalReceive = size;
	_status->received = 0;

	while (!end)
	{
		int av = _socket->available();
		if (av < 0 || !_socket->waitInput(10)) {
			break;
		}
		byte buffer[RECV_BLOCK_SIZE];
		int maxToRead = _socket->available(), bytesRead = 0;
		if (chunked)
		{
			String chunkSize = _socket->readLine();
			maxToRead = chunkSize.hexToInt();
			if (maxToRead == 0)
				end = true;
		}
		while (maxToRead > 0) {
			bytesRead = _socket->read(buffer, min(maxToRead, (int)sizeof(buffer)));
			if (bytesRead <= 0) {
				return;
			}
			currentsize += bytesRead;
			_status->received = currentsize;
			_sink->write(buffer, bytesRead);
			if(_progress)
				_progress(*_status);
			maxToRead -= bytesRead;
			if (size) {
				size -= bytesRead;
				if (size <= 0) {
					return;
				}
			}
		}
		//if (maxToRead == 0) // ANDROID ?
		//	break;

		if (chunked)
		{
			if (_socket->read(buffer, 2) < 2) // skip crlf
				break;
		}
	}
	//printf("readbody end\n");
}